

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  char cVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  void *this_00;
  undefined8 uVar7;
  ostream *in_RSI;
  ulong in_RDI;
  char c;
  size_t i;
  ulong local_18;
  
  for (local_18 = 0; uVar4 = std::__cxx11::string::size(), local_18 < uVar4; local_18 = local_18 + 1
      ) {
    pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar5;
    switch(cVar1) {
    case '\"':
      if (*(int *)(in_RDI + 0x20) == 1) {
        std::operator<<(in_RSI,"&quot;");
      }
      else {
        std::operator<<(in_RSI,cVar1);
      }
      break;
    default:
      if (((cVar1 < '\t') || (('\r' < cVar1 && (cVar1 < ' ')))) || (cVar1 == '\x7f')) {
        poVar6 = std::operator<<(in_RSI,"&#x");
        this_00 = (void *)std::ostream::operator<<(poVar6,std::uppercase);
        uVar7 = std::ostream::operator<<(this_00,std::hex);
        _Var2 = std::setfill<char>('0');
        poVar6 = std::operator<<(uVar7,_Var2._M_c);
        _Var3 = std::setw(2);
        poVar6 = std::operator<<(poVar6,_Var3);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)cVar1);
        std::operator<<(poVar6,';');
      }
      else {
        std::operator<<(in_RSI,cVar1);
      }
      break;
    case '&':
      std::operator<<(in_RSI,"&amp;");
      break;
    case '<':
      std::operator<<(in_RSI,"&lt;");
      break;
    case '>':
      if (((local_18 < 3) ||
          (pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar5 != ']')) ||
         (pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar5 != ']')) {
        std::operator<<(in_RSI,cVar1);
      }
      else {
        std::operator<<(in_RSI,"&gt;");
      }
    }
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465 and
                        // by @mrpi PR #588
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << static_cast<int>( c ) << ';';
                        else
                            os << c;
                }
            }
        }